

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhCursorPrevPage(lhash_kv_cursor *pPtr)

{
  int iVar1;
  int in_R8D;
  lhash_bmap_rec *plVar2;
  lhpage *pPage;
  lhpage *local_20;
  
  plVar2 = pPtr->pRec;
  if (plVar2 != (lhash_bmap_rec *)0x0) {
    do {
      if ((pPtr->iState == 2) && (pPtr->pRaw != (unqlite_page *)0x0)) {
        (*pPtr->pStore->pIo->xPageUnref)(pPtr->pRaw);
        pPtr->pRaw = (unqlite_page *)0x0;
      }
      pPtr->pRec = plVar2->pNext;
      iVar1 = lhLoadPage((lhash_kv_engine *)pPtr->pStore,plVar2->iReal,(lhpage *)0x0,&local_20,
                         in_R8D);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (local_20->pFirst != (lhcell *)0x0) {
        pPtr->pCell = local_20->pFirst;
        pPtr->iState = 2;
        pPtr->pRaw = local_20->pRaw;
        return 0;
      }
      (*local_20->pHash->pIo->xPageUnref)(local_20->pRaw);
      plVar2 = pPtr->pRec;
    } while (plVar2 != (lhash_bmap_rec *)0x0);
  }
  pPtr->iState = 3;
  return -0x1c;
}

Assistant:

static int lhCursorPrevPage(lhash_kv_cursor *pPtr)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pPtr;
	lhash_bmap_rec *pRec;
	lhpage *pPage;
	int rc;
	for(;;){
		pRec = pCur->pRec;
		if( pRec == 0 ){
			pCur->iState = L_HASH_CURSOR_STATE_DONE;
			return UNQLITE_DONE;
		}
		if( pPtr->iState == L_HASH_CURSOR_STATE_CELL && pPtr->pRaw ){
			/* Unref this page */
			pCur->pStore->pIo->xPageUnref(pPtr->pRaw);
			pPtr->pRaw = 0;
		}
		/* Advance the map cursor */
		pCur->pRec = pRec->pNext; /* Not a bug, reverse link */
		/* Load the previous page on the list */
		rc = lhLoadPage((lhash_kv_engine *)pCur->pStore,pRec->iReal,0,&pPage,0);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		if( pPage->pFirst ){
			/* Reflect the change */
			pCur->pCell = pPage->pFirst;
			pCur->iState = L_HASH_CURSOR_STATE_CELL;
			pCur->pRaw = pPage->pRaw;
			break;
		}
		/* Discard this page and continue */
		pPage->pHash->pIo->xPageUnref(pPage->pRaw);
	}
	return UNQLITE_OK;
}